

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ravi_alloc.c
# Opt level: O2

mstate init_user_mstate(char *tbase,size_t tsize)

{
  char *pcVar1;
  uint uVar2;
  ulong uVar3;
  mstate m;
  
  uVar3 = (ulong)(-(int)tbase - 0x10U & 0xf);
  m = (mstate)(tbase + uVar3 + 0x10);
  memset(m,0,0x3b0);
  pcVar1 = tbase + uVar3 + 8;
  pcVar1[0] = -0x4d;
  pcVar1[1] = '\x03';
  pcVar1[2] = '\0';
  pcVar1[3] = '\0';
  pcVar1[4] = '\0';
  pcVar1[5] = '\0';
  pcVar1[6] = '\0';
  pcVar1[7] = '\0';
  *(char **)(tbase + uVar3 + 0x28) = tbase;
  *(char **)(tbase + uVar3 + 0x388) = tbase;
  *(size_t *)(tbase + uVar3 + 0x370) = tsize;
  *(size_t *)(tbase + uVar3 + 0x368) = tsize;
  *(size_t *)(tbase + uVar3 + 0x390) = tsize;
  *(size_t *)(tbase + uVar3 + 0x50) = mparams.magic;
  pcVar1 = tbase + uVar3 + 0x48;
  pcVar1[0] = -1;
  pcVar1[1] = '\x0f';
  pcVar1[2] = '\0';
  pcVar1[3] = '\0';
  pcVar1[4] = '\0';
  pcVar1[5] = '\0';
  pcVar1[6] = '\0';
  pcVar1[7] = '\0';
  uVar2 = mparams.default_mflags | 4;
  pcVar1 = tbase + uVar3 + 0x3a8;
  pcVar1[0] = '\0';
  pcVar1[1] = '\0';
  pcVar1[2] = '\0';
  pcVar1[3] = '\0';
  pcVar1[4] = '\0';
  pcVar1[5] = '\0';
  pcVar1[6] = '\0';
  pcVar1[7] = '\0';
  pcVar1 = tbase + uVar3 + 0x3b0;
  pcVar1[0] = '\0';
  pcVar1[1] = '\0';
  pcVar1[2] = '\0';
  pcVar1[3] = '\0';
  pcVar1[4] = '\0';
  pcVar1[5] = '\0';
  pcVar1[6] = '\0';
  pcVar1[7] = '\0';
  *(uint *)(tbase + uVar3 + 0x380) = uVar2;
  init_bins(m);
  init_top(m,(mchunkptr)(tbase + (*(ulong *)(tbase + uVar3 + 8) & 0xfffffffffffffff8) + uVar3),
           (size_t)(tbase + (tsize - (long)(tbase + (*(ulong *)(tbase + uVar3 + 8) &
                                                    0xfffffffffffffff8) + uVar3)) + -0x50));
  return m;
}

Assistant:

static mstate init_user_mstate(char* tbase, size_t tsize) {
  size_t msize = pad_request(sizeof(struct malloc_state));
  mchunkptr mn;
  mchunkptr msp = align_as_chunk(tbase);
  mstate m = (mstate)(chunk2mem(msp));
  memset(m, 0, msize);
  (void)INITIAL_LOCK(&m->mutex);
  msp->head = (msize|INUSE_BITS);
  m->seg.base = m->least_addr = tbase;
  m->seg.size = m->footprint = m->max_footprint = tsize;
  m->magic = mparams.magic;
  m->release_checks = MAX_RELEASE_CHECK_RATE;
  m->mflags = mparams.default_mflags;
  m->extp = 0;
  m->exts = 0;
  disable_contiguous(m);
  init_bins(m);
  mn = next_chunk(mem2chunk(m));
  init_top(m, mn, (size_t)((tbase + tsize) - (char*)mn) - TOP_FOOT_SIZE);
  check_top_chunk(m, m->top);
  return m;
}